

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_mod.c
# Opt level: O0

void zzSubWMod_fast(word *b,word *a,word w,word *mod,size_t n)

{
  word wVar1;
  word *in_RCX;
  word in_RDX;
  word *in_RSI;
  word *in_RDI;
  size_t in_R8;
  
  wVar1 = zzSubW(in_RDI,in_RSI,in_R8,in_RDX);
  if (wVar1 != 0) {
    zzAdd2(in_RDI,in_RCX,in_R8);
  }
  return;
}

Assistant:

void FAST(zzSubWMod)(word b[], const word a[], register word w, 
	const word mod[], size_t n)
{
	ASSERT(wwIsSameOrDisjoint(a, b, n));
	ASSERT(wwIsDisjoint(b, mod, n));
	ASSERT(wwCmp(a, mod, n) < 0 && wwCmpW(mod, n, w) > 0);
	// a < w => a - w + mod < mod
	if (zzSubW(b, a, n, w))
		zzAdd2(b, mod, n);
	w = 0;
}